

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

Expr * __thiscall SQCompilation::SQParser::LogicalAndExp(SQParser *this)

{
  BinExpr *args_1;
  Expr *args_2;
  
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  args_1 = (BinExpr *)BitwiseOrExp(this);
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  if (this->_token == 0x10e) {
    Lex(this);
    args_2 = LogicalAndExp(this);
    args_1 = newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                       (this,TO_ANDAND,(Expr *)args_1,args_2);
  }
  this->_depth = this->_depth - 2;
  return &args_1->super_Expr;
}

Assistant:

Expr* SQParser::LogicalAndExp()
{
    NestingChecker nc(this);
    Expr *lhs = BitwiseOrExp();
    for (;;) {
        nc.inc();
        switch (_token) {
        case TK_AND: {
            Lex();

            Expr *rhs = LogicalAndExp();
            lhs = newNode<BinExpr>(TO_ANDAND, lhs, rhs);
        }
        default:
            return lhs;
        }
    }
}